

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapePaddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  int iVar1;
  LogMessage *pLVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar3;
  ShapeRange *pSVar4;
  LayerUnion from;
  size_t val;
  BorderAmounts *pBVar5;
  BorderAmounts *pBVar6;
  size_t val_00;
  size_t val_01;
  PaddingLayerParams padding;
  LogMessage LStack_b8;
  size_t local_80;
  ShapeRange local_78;
  PaddingLayerParams local_58;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar3 = ShapeConstraint::sequenceRange(this_01);
  pSVar4 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&LStack_b8,pSVar3,pSVar4);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  pSVar4 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&LStack_b8,pSVar3,pSVar4);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar3);
  if (specLayer->_oneof_case_[0] == 200) {
    from = specLayer->layer_;
  }
  else {
    from.padding_ = Specification::PaddingLayerParams::default_instance();
  }
  Specification::PaddingLayerParams::PaddingLayerParams(&local_58,from.padding_);
  pBVar5 = local_58.paddingamounts_;
  if (local_58.paddingamounts_ == (BorderAmounts *)0x0) {
    pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  iVar1 = (pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 == 0) {
    val_01 = 0;
    val = 0;
    local_80 = 0;
    val_00 = 0;
  }
  else {
    if (iVar1 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
    }
    pBVar6 = local_58.paddingamounts_;
    if (local_58.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar6 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    local_80 = *(size_t *)
                ((long)((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                0x10);
    if ((pBVar6->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
    }
    pBVar5 = local_58.paddingamounts_;
    if (local_58.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val_00 = *(size_t *)
              ((long)((pBVar6->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18)
    ;
    if ((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
    }
    if (local_58.paddingamounts_ == (BorderAmounts *)0x0) {
      local_58.paddingamounts_ = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val_01 = *(size_t *)
              (*(long *)((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x10);
    if (((local_58.paddingamounts_)->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&LStack_b8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_b8);
    }
    val = *(size_t *)
           (*(long *)(((local_58.paddingamounts_)->borderamounts_).super_RepeatedPtrFieldBase.rep_ +
                     1) + 0x18);
  }
  pSVar3 = ShapeConstraint::channelRange(this_01);
  pSVar4 = ShapeConstraint::channelRange(this_00);
  ShapeRange::intersect((ShapeRange *)&LStack_b8,pSVar3,pSVar4);
  ShapeConstraint::updateChannelRange(this_01,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::heightRange(this_00);
  ShapeRange::operator+(&local_78,pSVar3,local_80);
  ShapeRange::operator+((ShapeRange *)&LStack_b8,&local_78,val_00);
  ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::widthRange(this_00);
  ShapeRange::operator+(&local_78,pSVar3,val);
  ShapeRange::operator+((ShapeRange *)&LStack_b8,&local_78,val_01);
  ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::heightRange(this_01);
  ShapeRange::operator-(&local_78,pSVar3,local_80);
  ShapeRange::operator-((ShapeRange *)&LStack_b8,&local_78,val_00);
  ShapeConstraint::updateHeightRange(this_00,(ShapeRange *)&LStack_b8);
  pSVar3 = ShapeConstraint::widthRange(this_01);
  ShapeRange::operator-(&local_78,pSVar3,val_01);
  ShapeRange::operator-((ShapeRange *)&LStack_b8,&local_78,val);
  ShapeConstraint::updateWidthRange(this_00,(ShapeRange *)&LStack_b8);
  Specification::PaddingLayerParams::~PaddingLayerParams(&local_58);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePaddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    Specification::PaddingLayerParams padding = specLayer.padding();

    size_t l, r, t, b;
    l = r = t = b = 0;
    if (padding.paddingamounts().borderamounts_size() != 0){
        t = (size_t)padding.paddingamounts().borderamounts(0).startedgesize();
        b = (size_t)padding.paddingamounts().borderamounts(0).endedgesize();
        l = (size_t)padding.paddingamounts().borderamounts(1).startedgesize();
        r = (size_t)padding.paddingamounts().borderamounts(1).endedgesize();
    }
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
    outputShape.updateHeightRange(inputShape.heightRange() + t + b);
    outputShape.updateWidthRange(inputShape.widthRange() + r + l);
    
    // If a fixed constraint for the output shape emerges later in the network, then we can infer a lower bound for the input shape
    inputShape.updateHeightRange(outputShape.heightRange() - t - b);
    inputShape.updateWidthRange(outputShape.widthRange() - l - r);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}